

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O2

int Cudd_bddVarConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  DdHalfWord i;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdHalfWord i_00;
  
  pDVar4 = Cudd_Support(dd,f);
  if (pDVar4 == (DdNode *)0x0) {
    return 0;
  }
  if (*(int *)((ulong)pDVar4 & 0xfffffffffffffffe) == 0x7fffffff) {
    ppDVar5 = (DdNode **)malloc(8);
    *conjuncts = ppDVar5;
    if (ppDVar5 != (DdNode **)0x0) {
      *ppDVar5 = f;
      piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      return 1;
    }
  }
  else {
    piVar1 = (int *)((ulong)pDVar4 & 0xfffffffffffffffe) + 1;
    *piVar1 = *piVar1 + 1;
    i_00 = 0xffffffff;
    iVar7 = 1000000000;
    for (pDVar6 = pDVar4; *(int *)((ulong)pDVar6 & 0xfffffffffffffffe) != 0x7fffffff;
        pDVar6 = (pDVar6->type).kids.T) {
      i = pDVar6->index;
      iVar2 = Cudd_EstimateCofactor(dd,f,i,1);
      iVar3 = Cudd_EstimateCofactor(dd,f,i,0);
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar3 < iVar7) {
        i_00 = i;
        iVar7 = iVar3;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar4 = Cudd_bddIthVar(dd,i_00);
    pDVar6 = Cudd_bddOr(dd,f,pDVar4);
    if (pDVar6 == (DdNode *)0x0) {
      return 0;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = Cudd_bddOr(dd,f,(DdNode *)((ulong)pDVar4 ^ 1));
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar6);
      return 0;
    }
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    if (pDVar6 == dd->one) {
      Cudd_RecursiveDeref(dd,pDVar6);
      ppDVar5 = (DdNode **)malloc(8);
      *conjuncts = ppDVar5;
      if (ppDVar5 != (DdNode **)0x0) {
        *ppDVar5 = pDVar4;
        return 1;
      }
    }
    else if (pDVar4 == dd->one) {
      Cudd_RecursiveDeref(dd,pDVar4);
      ppDVar5 = (DdNode **)malloc(8);
      *conjuncts = ppDVar5;
      pDVar4 = pDVar6;
      if (ppDVar5 != (DdNode **)0x0) {
        *ppDVar5 = pDVar6;
        return 1;
      }
    }
    else {
      ppDVar5 = (DdNode **)malloc(0x10);
      *conjuncts = ppDVar5;
      if (ppDVar5 != (DdNode **)0x0) {
        *ppDVar5 = pDVar6;
        ppDVar5[1] = pDVar4;
        return 2;
      }
      Cudd_RecursiveDeref(dd,pDVar6);
    }
    Cudd_RecursiveDeref(dd,pDVar4);
  }
  dd->errorCode = CUDD_MEMORY_OUT;
  return 0;
}

Assistant:

int
Cudd_bddVarConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the array of conjuncts */)
{
    int best;
    int min;
    DdNode *support, *scan, *var, *glocal, *hlocal;

    /* Find best cofactoring variable. */
    support = Cudd_Support(dd,f);
    if (support == NULL) return(0);
    if (Cudd_IsConstant(support)) {
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = f;
        cuddRef((*conjuncts)[0]);
        return(1);
    }
    cuddRef(support);
    min = 1000000000;
    best = -1;
    scan = support;
    while (!Cudd_IsConstant(scan)) {
        int i = scan->index;
        int est1 = Cudd_EstimateCofactor(dd,f,i,1);
        int est0 = Cudd_EstimateCofactor(dd,f,i,0);
        /* Minimize the size of the larger of the two cofactors. */
        int est = (est1 > est0) ? est1 : est0;
        if (est < min) {
            min = est;
            best = i;
        }
        scan = cuddT(scan);
    }
#ifdef DD_DEBUG
    assert(best >= 0 && best < dd->size);
#endif
    Cudd_RecursiveDeref(dd,support);

    var = Cudd_bddIthVar(dd,best);
    glocal = Cudd_bddOr(dd,f,var);
    if (glocal == NULL) {
        return(0);
    }
    cuddRef(glocal);
    hlocal = Cudd_bddOr(dd,f,Cudd_Not(var));
    if (hlocal == NULL) {
        Cudd_RecursiveDeref(dd,glocal);
        return(0);
    }
    cuddRef(hlocal);

    if (glocal != DD_ONE(dd)) {
        if (hlocal != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}